

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ObjComputeCuts(Jf_Man_t *p,Gia_Obj_t *pObj,int fEdge)

{
  Sdm_Man_t *p_00;
  Vec_Int_t *p_01;
  int ObjId;
  int iVar1;
  int iVar2;
  int iDsdLit1;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  word wVar7;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  float fVar10;
  float fVar11;
  int local_6fc;
  int local_6f4;
  int local_6d8;
  int local_6cc;
  int local_68c;
  int local_688;
  int c;
  int k;
  int i;
  int Config;
  int nOldSupp;
  int *pCuts1;
  int *pCuts0;
  int *pCut1;
  int *pCut0;
  Jf_Cut_t *pSto [18];
  Jf_Cut_t Sto [18];
  word Sign1 [18];
  word Sign0 [18];
  int iObj;
  int CutNum;
  int LutSize;
  int fEdge_local;
  Gia_Obj_t *pObj_local;
  Jf_Man_t *p_local;
  
  iVar4 = p->pPars->nLutSize;
  iVar5 = p->pPars->nCutNum;
  ObjId = Gia_ObjId(p->pGia,pObj);
  local_68c = 0;
  for (c = 0; c <= iVar5 + 1; c = c + 1) {
    pSto[(long)c + -1] = (Jf_Cut_t *)(Sto[(long)c + -1].pCut + 8);
    pSto[(long)c + -1]->Cost = 0;
    pSto[(long)c + -1]->iFunc = -1;
  }
  iVar1 = Gia_ObjFaninId0(pObj,ObjId);
  piVar6 = Jf_ObjCuts(p,iVar1);
  c = 0;
  pCut1 = piVar6 + 1;
  while (c < *piVar6) {
    wVar7 = Jf_CutGetSign(pCut1);
    Sign1[(long)c + 0x11] = wVar7;
    c = c + 1;
    iVar1 = Jf_CutSize(pCut1);
    pCut1 = pCut1 + (iVar1 + 1);
  }
  iVar1 = Gia_ObjFaninId1(pObj,ObjId);
  piVar8 = Jf_ObjCuts(p,iVar1);
  c = 0;
  pCuts0 = piVar8 + 1;
  while (c < *piVar8) {
    wVar7 = Jf_CutGetSign(pCuts0);
    Sign1[(long)c + -1] = wVar7;
    c = c + 1;
    iVar1 = Jf_CutSize(pCuts0);
    pCuts0 = pCuts0 + (iVar1 + 1);
  }
  p->CutCount[0] = (long)(*piVar6 * *piVar8) + p->CutCount[0];
  c = 0;
  pCut1 = piVar6 + 1;
  while (c < *piVar6) {
    local_688 = 0;
    pCuts0 = piVar8 + 1;
    while (local_688 < *piVar8) {
      iVar1 = Jf_CountBits(Sign1[(long)c + 0x11] | Sign1[(long)local_688 + -1]);
      if (iVar1 <= iVar4) {
        p->CutCount[1] = p->CutCount[1] + 1;
        if (p->pPars->fCutMin == 0) {
          iVar1 = Jf_CutMergeOrder(pCut1,pCuts0,pSto[(long)local_68c + -1]->pCut,iVar4);
          if (iVar1 != 0) {
            pSto[(long)local_68c + -1]->Sign = Sign1[(long)c + 0x11] | Sign1[(long)local_688 + -1];
LAB_0090172f:
            p->CutCount[2] = p->CutCount[2] + 1;
            if (p->pPars->fAreaOnly == 0) {
              local_6cc = Jf_CutArr(p,pSto[(long)local_68c + -1]->pCut);
            }
            else {
              local_6cc = 0;
            }
            pSto[(long)local_68c + -1]->Time = local_6cc;
            fVar10 = Jf_CutFlow(p,pSto[(long)local_68c + -1]->pCut);
            pSto[(long)local_68c + -1]->Flow = fVar10;
            local_68c = Jf_ObjAddCutToStore(p,(Jf_Cut_t **)&pCut0,local_68c,iVar5);
            if (iVar5 < local_68c) {
              __assert_fail("c <= CutNum",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                            ,0x4a9,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
            }
          }
        }
        else if (p->pPars->fFuncDsd == 0) {
          iVar1 = Jf_CutMergeOrder(pCut1,pCuts0,pSto[(long)local_68c + -1]->pCut,iVar4);
          if (iVar1 != 0) {
            pSto[(long)local_68c + -1]->Sign = Sign1[(long)c + 0x11] | Sign1[(long)local_688 + -1];
            iVar1 = pSto[(long)local_68c + -1]->pCut[0];
            iVar3 = Jf_ObjFunc0(pObj,pCut1);
            iVar2 = Jf_ObjFunc1(pObj,pCuts0);
            iVar3 = Jf_TtComputeForCut(p,iVar3,iVar2,pCut1,pCuts0,pSto[(long)local_68c + -1]->pCut);
            pSto[(long)local_68c + -1]->iFunc = iVar3;
            if (iVar1 < pSto[(long)local_68c + -1]->pCut[0]) {
              __assert_fail("pSto[c]->pCut[0] <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                            ,0x49f,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
            }
            if (pSto[(long)local_68c + -1]->pCut[0] < iVar1) {
              wVar7 = Jf_CutGetSign(pSto[(long)local_68c + -1]->pCut);
              pSto[(long)local_68c + -1]->Sign = wVar7;
            }
            if (0xffffff < pSto[(long)local_68c + -1]->iFunc) {
              printf(
                    "Hard limit on the number of different Boolean functions (2^23) is reached. Quitting...\n"
                    );
              exit(1);
            }
            goto LAB_0090172f;
          }
        }
        else {
          iVar1 = Jf_CutMerge2(pCut1,pCuts0,pSto[(long)local_68c + -1]->pCut,iVar4);
          if (iVar1 != 0) {
            pSto[(long)local_68c + -1]->Sign = Sign1[(long)c + 0x11] | Sign1[(long)local_688 + -1];
            iVar3 = pSto[(long)local_68c + -1]->pCut[0];
            p_00 = p->pDsd;
            iVar2 = Jf_ObjFunc0(pObj,pCut1);
            iDsdLit1 = Jf_ObjFunc1(pObj,pCuts0);
            iVar1 = Sdm_ManComputeFunc(p_00,iVar2,iDsdLit1,pSto[(long)local_68c + -1]->pCut,iVar1,0)
            ;
            pSto[(long)local_68c + -1]->iFunc = iVar1;
            if (pSto[(long)local_68c + -1]->iFunc != -1) {
              if (p->pPars->fGenCnf != 0) {
                iVar1 = Abc_Lit2Var(pSto[(long)local_68c + -1]->iFunc);
                iVar1 = Jf_CutCnfSizeF(p,iVar1);
                if (0xb < iVar1) goto LAB_00901814;
              }
              if (iVar3 < pSto[(long)local_68c + -1]->pCut[0]) {
                __assert_fail("pSto[c]->pCut[0] <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                              ,0x494,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
              }
              if (pSto[(long)local_68c + -1]->pCut[0] < iVar3) {
                wVar7 = Jf_CutGetSign(pSto[(long)local_68c + -1]->pCut);
                pSto[(long)local_68c + -1]->Sign = wVar7;
              }
              goto LAB_0090172f;
            }
          }
        }
      }
LAB_00901814:
      local_688 = local_688 + 1;
      iVar1 = Jf_CutSize(pCuts0);
      pCuts0 = pCuts0 + (iVar1 + 1);
    }
    c = c + 1;
    iVar1 = Jf_CutSize(pCut1);
    pCut1 = pCut1 + (iVar1 + 1);
  }
  iVar4 = Jf_ObjIsUnit(pObj);
  if ((iVar4 == 0) && (iVar4 = Jf_ObjHasCutWithSize((Jf_Cut_t **)&pCut0,local_68c,2), iVar4 == 0)) {
    pGVar9 = Gia_ObjFanin0(pObj);
    iVar4 = Jf_ObjIsUnit(pGVar9);
    if (iVar4 != 0) {
      pGVar9 = Gia_ObjFanin1(pObj);
      iVar4 = Jf_ObjIsUnit(pGVar9);
      if (iVar4 != 0) {
        if (p->pPars->fCutMin != 0) {
          pSto[(long)local_68c + -1]->iFunc = 4;
        }
        pSto[(long)local_68c + -1]->pCut[0] = 2;
        iVar4 = Gia_ObjFaninId0(pObj,ObjId);
        iVar5 = Gia_ObjFaninC0(pObj);
        iVar4 = Jf_ObjLit(iVar4,iVar5);
        pSto[(long)local_68c + -1]->pCut[1] = iVar4;
        iVar4 = Gia_ObjFaninId1(pObj,ObjId);
        iVar5 = Gia_ObjFaninC1(pObj);
        iVar4 = Jf_ObjLit(iVar4,iVar5);
        pSto[(long)local_68c + -1]->pCut[2] = iVar4;
        local_68c = local_68c + 1;
        goto LAB_009019d0;
      }
    }
    __assert_fail("Jf_ObjIsUnit(Gia_ObjFanin0(pObj)) && Jf_ObjIsUnit(Gia_ObjFanin1(pObj))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x4b0,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
  }
LAB_009019d0:
  iVar4 = Jf_ObjIsUnit(pObj);
  if ((iVar4 != 0) &&
     ((p->pPars->fCutMin == 0 ||
      (iVar4 = Jf_ObjHasCutWithSize((Jf_Cut_t **)&pCut0,local_68c,1), iVar4 == 0)))) {
    if (p->pPars->fCutMin != 0) {
      pSto[(long)local_68c + -1]->iFunc = 2;
    }
    pSto[(long)local_68c + -1]->pCut[0] = 1;
    iVar4 = Jf_ObjLit(ObjId,0);
    pSto[(long)local_68c + -1]->pCut[1] = iVar4;
    local_68c = local_68c + 1;
  }
  if (p->pPars->fGenCnf == 0) {
    local_6d8 = 1;
  }
  else {
    iVar4 = Abc_Lit2Var(pCut0[4]);
    local_6d8 = Jf_CutCnfSizeF(p,iVar4);
  }
  pCut0[5] = local_6d8;
  if (pCut0[5] < 0) {
    __assert_fail("pSto[0]->Cost >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x4c4,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
  }
  if ((float)pCut0[2] < 0.0) {
    __assert_fail("pSto[0]->Flow >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x4c6,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
  }
  Vec_IntWriteEntry(&p->vArr,ObjId,pCut0[3]);
  fVar10 = (float)pCut0[2];
  if (fEdge == 0) {
    local_6f4 = pCut0[5];
  }
  else {
    local_6f4 = pCut0[6];
  }
  fVar11 = Jf_ObjRefs(p,ObjId);
  Vec_FltWriteEntry(&p->vFlow,ObjId,(fVar10 + (float)local_6f4) / fVar11);
  Vec_IntClear(p->vTemp);
  Vec_IntPush(p->vTemp,local_68c);
  for (c = 0; c < local_68c; c = c + 1) {
    if (p->pPars->fGenCnf == 0) {
      local_6fc = 1;
    }
    else {
      iVar4 = Abc_Lit2Var(pSto[(long)c + -1]->iFunc);
      local_6fc = Jf_CutCnfSizeF(p,iVar4);
    }
    pSto[(long)c + -1]->Cost = local_6fc;
    p_01 = p->vTemp;
    iVar4 = Jf_CutSetAll(pSto[(long)c + -1]->iFunc,pSto[(long)c + -1]->Cost,
                         pSto[(long)c + -1]->pCut[0]);
    Vec_IntPush(p_01,iVar4);
    for (local_688 = 1; local_688 <= pSto[(long)c + -1]->pCut[0]; local_688 = local_688 + 1) {
      Vec_IntPush(p->vTemp,pSto[(long)c + -1]->pCut[local_688]);
    }
  }
  piVar6 = Vec_IntArray(p->vTemp);
  iVar4 = Vec_IntSize(p->vTemp);
  iVar4 = Vec_SetAppend(&p->pMem,piVar6,iVar4);
  Vec_IntWriteEntry(&p->vCuts,ObjId,iVar4);
  p->CutCount[3] = (long)local_68c + p->CutCount[3];
  return;
}

Assistant:

void Jf_ObjComputeCuts( Jf_Man_t * p, Gia_Obj_t * pObj, int fEdge )
{
    int        LutSize = p->pPars->nLutSize;
    int        CutNum = p->pPars->nCutNum;
    int        iObj = Gia_ObjId(p->pGia, pObj);
    word       Sign0[JF_CUT_MAX+2]; // signatures of the first cut
    word       Sign1[JF_CUT_MAX+2]; // signatures of the second cut
    Jf_Cut_t   Sto[JF_CUT_MAX+2];   // cut storage
    Jf_Cut_t * pSto[JF_CUT_MAX+2];  // pointers to cut storage
    int *      pCut0, * pCut1, * pCuts0, * pCuts1;
    int        nOldSupp, Config, i, k, c = 0;
    // prepare cuts
    for ( i = 0; i <= CutNum+1; i++ )
        pSto[i] = Sto + i, pSto[i]->Cost = 0, pSto[i]->iFunc = ~0;
    // compute signatures
    pCuts0 = Jf_ObjCuts( p, Gia_ObjFaninId0(pObj, iObj) );
    Jf_ObjForEachCut( pCuts0, pCut0, i )
        Sign0[i] = Jf_CutGetSign( pCut0 );
    // compute signatures
    pCuts1 = Jf_ObjCuts( p, Gia_ObjFaninId1(pObj, iObj) );
    Jf_ObjForEachCut( pCuts1, pCut1, i )
        Sign1[i] = Jf_CutGetSign( pCut1 );
    // merge cuts
    p->CutCount[0] += pCuts0[0] * pCuts1[0];
    Jf_ObjForEachCut( pCuts0, pCut0, i )
    Jf_ObjForEachCut( pCuts1, pCut1, k )
    {
        if ( Jf_CountBits(Sign0[i] | Sign1[k]) > LutSize )
            continue;
        p->CutCount[1]++;        
        if ( !p->pPars->fCutMin )
        {
            if ( !Jf_CutMergeOrder(pCut0, pCut1, pSto[c]->pCut, LutSize) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
        }
        else if ( p->pPars->fFuncDsd )
        {
            if ( !(Config = Jf_CutMerge2(pCut0, pCut1, pSto[c]->pCut, LutSize)) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
            nOldSupp = pSto[c]->pCut[0];
            pSto[c]->iFunc = Sdm_ManComputeFunc( p->pDsd, Jf_ObjFunc0(pObj, pCut0), Jf_ObjFunc1(pObj, pCut1), pSto[c]->pCut, Config, 0 );
            if ( pSto[c]->iFunc == -1 )
                continue;
            if ( p->pPars->fGenCnf && Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[c]->iFunc)) >= 12 ) // no more than 15
                continue;
            assert( pSto[c]->pCut[0] <= nOldSupp );
            if ( pSto[c]->pCut[0] < nOldSupp )
                pSto[c]->Sign = Jf_CutGetSign( pSto[c]->pCut );
        }
        else
        {
            if ( !Jf_CutMergeOrder(pCut0, pCut1, pSto[c]->pCut, LutSize) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
            nOldSupp = pSto[c]->pCut[0];
            pSto[c]->iFunc = Jf_TtComputeForCut( p, Jf_ObjFunc0(pObj, pCut0), Jf_ObjFunc1(pObj, pCut1), pCut0, pCut1, pSto[c]->pCut );
            assert( pSto[c]->pCut[0] <= nOldSupp );
            if ( pSto[c]->pCut[0] < nOldSupp )
                pSto[c]->Sign = Jf_CutGetSign( pSto[c]->pCut );
            if ( pSto[c]->iFunc >= (1 << 24) )
                printf( "Hard limit on the number of different Boolean functions (2^23) is reached. Quitting...\n" ), exit(1);
        }
        p->CutCount[2]++;
        pSto[c]->Time = p->pPars->fAreaOnly ? 0 : Jf_CutArr(p, pSto[c]->pCut);
        pSto[c]->Flow = Jf_CutFlow(p, pSto[c]->pCut);
        c = Jf_ObjAddCutToStore( p, pSto, c, CutNum );
        assert( c <= CutNum );
    }
//    Jf_ObjPrintStore( p, pSto, c );
//    Jf_ObjCheckStore( p, pSto, c, iObj );
    // add two variable cut
    if ( !Jf_ObjIsUnit(pObj) && !Jf_ObjHasCutWithSize(pSto, c, 2) )
    {
        assert( Jf_ObjIsUnit(Gia_ObjFanin0(pObj)) && Jf_ObjIsUnit(Gia_ObjFanin1(pObj)) );
        if ( p->pPars->fCutMin ) pSto[c]->iFunc = 4;  // set function (DSD only!)
        pSto[c]->pCut[0] = 2; 
        pSto[c]->pCut[1] = Jf_ObjLit(Gia_ObjFaninId0(pObj, iObj), Gia_ObjFaninC0(pObj)); 
        pSto[c]->pCut[2] = Jf_ObjLit(Gia_ObjFaninId1(pObj, iObj), Gia_ObjFaninC1(pObj)); 
        c++;
    }
    // add elementary cut
    if ( Jf_ObjIsUnit(pObj) && !(p->pPars->fCutMin && Jf_ObjHasCutWithSize(pSto, c, 1)) )
    {
        if ( p->pPars->fCutMin ) pSto[c]->iFunc = 2;  // set function
        pSto[c]->pCut[0] = 1;
        pSto[c]->pCut[1] = Jf_ObjLit(iObj, 0);
        c++;
    }
    // reorder cuts
//    Jf_ObjSortCuts( pSto + 1, c - 1 );
//    Jf_ObjCheckPtrs( pSto, CutNum );
    // find cost of the best cut
    pSto[0]->Cost = p->pPars->fGenCnf ? Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[0]->iFunc)) : 1;
    assert( pSto[0]->Cost >= 0 );
    // save best info
    assert( pSto[0]->Flow >= 0 );
    Vec_IntWriteEntry( &p->vArr,  iObj, pSto[0]->Time );
    Vec_FltWriteEntry( &p->vFlow, iObj, (pSto[0]->Flow + (fEdge ? pSto[0]->pCut[0] : pSto[0]->Cost)) / Jf_ObjRefs(p, iObj) );
    // add cuts to storage cuts
    Vec_IntClear( p->vTemp );
    Vec_IntPush( p->vTemp, c );
    for ( i = 0; i < c; i++ )
    {
        pSto[i]->Cost = p->pPars->fGenCnf ? Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[i]->iFunc)) : 1;
        Vec_IntPush( p->vTemp, Jf_CutSetAll(pSto[i]->iFunc, pSto[i]->Cost, pSto[i]->pCut[0]) );
        for ( k = 1; k <= pSto[i]->pCut[0]; k++ )
            Vec_IntPush( p->vTemp, pSto[i]->pCut[k] );
    }
    Vec_IntWriteEntry( &p->vCuts, iObj, Vec_SetAppend(&p->pMem, Vec_IntArray(p->vTemp), Vec_IntSize(p->vTemp)) );
    p->CutCount[3] += c;
}